

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BgzfStream::Open(BgzfStream *this,string *filename,OpenMode mode)

{
  int iVar1;
  IBamIODevice *pIVar2;
  BamException *this_00;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string message;
  string deviceError;
  
  Close(this);
  pIVar2 = BamDeviceFactory::CreateDevice(filename);
  this->m_device = pIVar2;
  iVar1 = (*pIVar2->_vptr_IBamIODevice[4])(pIVar2,(ulong)mode);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*this->m_device->_vptr_IBamIODevice[9])(&deviceError);
  std::__cxx11::string::string((string *)&local_78,"could not open BGZF stream: \n\t",&local_79);
  std::operator+(&message,&local_78,&deviceError);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_78,"BgzfStream::Open",&local_79);
  BamException::BamException(this_00,&local_78,&message);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BgzfStream::Open(const std::string& filename, const IBamIODevice::OpenMode mode)
{

    // close current device if necessary
    Close();
    BT_ASSERT_X((m_device == 0),
                "BgzfStream::Open() - unable to properly close previous IO device");

    // retrieve new IO device depending on filename
    m_device = BamDeviceFactory::CreateDevice(filename);
    BT_ASSERT_X(m_device, "BgzfStream::Open() - unable to create IO device from filename");

    // if device fails to open
    if (!m_device->Open(mode)) {
        const std::string deviceError = m_device->GetErrorString();
        const std::string message = std::string("could not open BGZF stream: \n\t") + deviceError;
        throw BamException("BgzfStream::Open", message);
    }
}